

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

MCode * lj_mcode_patch(jit_State *J,MCode *ptr,int finish)

{
  int iVar1;
  int in_EDX;
  ulong *in_RSI;
  long in_RDI;
  MCode *mc;
  size_t in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  jit_State *in_stack_fffffffffffffff8;
  ulong *sz;
  
  if (in_EDX == 0) {
    sz = *(ulong **)(in_RDI + 0x970);
    if ((in_RSI < sz) || ((ulong *)((long)sz + *(long *)(in_RDI + 0x988)) <= in_RSI)) {
      do {
        do {
          sz = (ulong *)*sz;
        } while (in_RSI < sz);
      } while ((ulong *)((long)sz + sz[1]) <= in_RSI);
      iVar1 = mcode_setprot((void *)(ulong)in_stack_ffffffffffffffe0,(size_t)sz,0);
      if (iVar1 != 0) {
        mcode_protfail(in_stack_fffffffffffffff8);
      }
    }
    else {
      mcode_protect((jit_State *)(ulong)in_stack_ffffffffffffffe0,(int)((ulong)sz >> 0x20));
    }
  }
  else {
    if (*(ulong **)(in_RDI + 0x970) == in_RSI) {
      mcode_protect((jit_State *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                    (int)(in_stack_ffffffffffffffd8 >> 0x20));
    }
    else {
      iVar1 = mcode_setprot((void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8,0);
      if (iVar1 != 0) {
        mcode_protfail(in_stack_fffffffffffffff8);
      }
    }
    sz = (ulong *)0x0;
  }
  return (MCode *)sz;
}

Assistant:

MCode *lj_mcode_patch(jit_State *J, MCode *ptr, int finish)
{
#ifdef LUAJIT_UNPROTECT_MCODE
  UNUSED(J); UNUSED(ptr); UNUSED(finish);
  return NULL;
#else
  if (finish) {
    if (J->mcarea == ptr)
      mcode_protect(J, MCPROT_RUN);
    else if (LJ_UNLIKELY(mcode_setprot(ptr, ((MCLink *)ptr)->size, MCPROT_RUN)))
      mcode_protfail(J);
    return NULL;
  } else {
    MCode *mc = J->mcarea;
    /* Try current area first to use the protection cache. */
    if (ptr >= mc && ptr < (MCode *)((char *)mc + J->szmcarea)) {
      mcode_protect(J, MCPROT_GEN);
      return mc;
    }
    /* Otherwise search through the list of MCode areas. */
    for (;;) {
      mc = ((MCLink *)mc)->next;
      lua_assert(mc != NULL);
      if (ptr >= mc && ptr < (MCode *)((char *)mc + ((MCLink *)mc)->size)) {
	if (LJ_UNLIKELY(mcode_setprot(mc, ((MCLink *)mc)->size, MCPROT_GEN)))
	  mcode_protfail(J);
	return mc;
      }
    }
  }
#endif
}